

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_quaternion rf_quaternion_from_axis_angle(rf_vec3 axis,float angle)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  rf_quaternion rVar9;
  
  fVar6 = axis.z;
  fVar5 = axis.x;
  fVar3 = axis.y;
  fVar7 = SQRT(fVar6 * fVar6 + fVar5 * fVar5 + fVar3 * fVar3);
  fVar2 = (float)(~-(uint)(fVar7 != 0.0) & (uint)angle | (uint)(angle * 0.5) & -(uint)(fVar7 != 0.0)
                 );
  fVar4 = (float)(-(uint)(fVar7 == 0.0) & 0x3f800000 | ~-(uint)(fVar7 == 0.0) & (uint)(1.0 / fVar7))
  ;
  fVar7 = sinf(fVar2);
  fVar2 = cosf(fVar2);
  fVar8 = fVar4 * fVar6 * fVar7;
  fVar6 = fVar7 * fVar4 * fVar5;
  fVar7 = fVar7 * fVar4 * fVar3;
  fVar5 = SQRT(fVar2 * fVar2 + fVar8 * fVar8 + fVar6 * fVar6 + fVar7 * fVar7);
  uVar1 = -(uint)(fVar5 == 0.0);
  fVar5 = (float)(uVar1 & 0x3f800000 | ~uVar1 & (uint)(1.0 / fVar5));
  rVar9.y = fVar5 * fVar7;
  rVar9.x = fVar5 * fVar6;
  rVar9.w = fVar5 * fVar2;
  rVar9.z = fVar5 * fVar8;
  return rVar9;
}

Assistant:

RF_API rf_quaternion rf_quaternion_from_axis_angle(rf_vec3 axis, float angle)
{
    rf_quaternion result = {0.0f, 0.0f, 0.0f, 1.0f};

    if (rf_vec3_len(axis) != 0.0f)

        angle *= 0.5f;

    axis = rf_vec3_normalize(axis);

    float sinres = sinf(angle);
    float cosres = cosf(angle);

    result.x = axis.x * sinres;
    result.y = axis.y * sinres;
    result.z = axis.z * sinres;
    result.w = cosres;

    result = rf_quaternion_normalize(result);

    return result;
}